

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O1

void __thiscall CompileCommandParser::ParseString(CompileCommandParser *this)

{
  std::__cxx11::string::_M_replace
            ((ulong)&this->String,0,(char *)(this->String)._M_string_length,0x1bee7c);
  if (this->C == '\"') {
    do {
      Next(this);
      if (0x20 < (ulong)(byte)this->C) break;
    } while ((0x100002600U >> ((ulong)(byte)this->C & 0x3f) & 1) != 0);
    while (this->C != '\"') {
      if (this->C == '\\') {
        do {
          Next(this);
          if (0x20 < (ulong)(byte)this->C) break;
        } while ((0x100002600U >> ((ulong)(byte)this->C & 0x3f) & 1) != 0);
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)&this->String,(this->String)._M_string_length,0,'\x01');
      Next(this);
    }
    do {
      Next(this);
      if (0x20 < (ulong)(byte)this->C) {
        return;
      }
    } while ((0x100002600U >> ((ulong)(byte)this->C & 0x3f) & 1) != 0);
  }
  return;
}

Assistant:

void ParseString()
  {
    this->String = "";
    if(!Expect('"')) return;
    while (!Expect('"'))
      {
      Expect('\\');
      this->String.append(1,C);
      Next();
      }
  }